

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_open_socket(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  int ret;
  uint local_4;
  
  local_4 = socket(0x1d,2,7);
  if ((int)local_4 < 0) {
    piVar1 = __errno_location();
    __stream = _stderr;
    local_4 = -*piVar1;
    pcVar2 = strerror(local_4);
    fprintf(__stream,"socket(j1939): %d (%s)",(ulong)local_4,pcVar2);
  }
  return local_4;
}

Assistant:

int libj1939_open_socket(void)
{
	int ret;

	/* Create a new CAN J1939 socket */
	ret = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (ret < 0) {
		/* Get the error code and print an error message */
		ret = -errno;
		pr_err("socket(j1939): %d (%s)", ret, strerror(ret));
		return ret;
	}
	return ret;
}